

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbtsub.c
# Opt level: O3

void bitbltsub(LispPTR *argv)

{
  DLword *pDVar1;
  DLword *pDVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  LispPTR LVar8;
  bool bVar9;
  DLword *pDVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  DLword grayword [4];
  uint local_e0;
  uint local_d4;
  
  if (kbd_for_makeinit == 0) {
    init_keyboard(0);
    kbd_for_makeinit = 1;
  }
  uVar11 = *argv;
  if ((uVar11 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar11);
  }
  pDVar1 = Lisp_world;
  uVar17 = argv[1];
  if ((uVar17 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar17);
  }
  pDVar2 = Lisp_world;
  uVar3 = (ushort)argv[2];
  uVar4 = (ushort)argv[3];
  uVar20 = argv[4];
  if ((uVar20 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar20);
  }
  pDVar10 = Lisp_world;
  uVar5 = pDVar1[(ulong)uVar11 + 9];
  uVar6 = pDVar1[(ulong)uVar11 + 8];
  if (uVar5 == 0 || uVar6 == 0) {
    return;
  }
  pDVar1 = Lisp_world + uVar20;
  uVar11 = argv[5];
  uVar20 = argv[6];
  uVar15 = uVar11 & 0xffff;
  uVar16 = (uint)REPLACE_atom;
  if (argv[9] != 0) {
    uVar16 = argv[9];
  }
  uVar19 = (uint)INPUT_atom;
  if (argv[8] != 0) {
    uVar19 = argv[8];
  }
  uVar18 = 1;
  if (uVar16 != ERASE_atom) {
    uVar18 = (uint)(uVar16 == INVERT_atom) * 3;
  }
  uVar13 = 2;
  if (uVar16 != PAINT_atom) {
    uVar13 = uVar18;
  }
  uVar7 = pDVar1[3];
  uVar16 = (uint)TEXTURE_atom;
  if (uVar19 == uVar16) {
    uVar17 = argv[10];
    LVar8 = argv[0xb];
    iVar12 = *(int *)pDVar1;
    if (((uVar17 != 0) &&
        ((*(byte *)(((ulong)(uVar17 >> 8 & 0xffffe) + (long)MDStypetbl ^ 2) + 1) & 0x10) == 0)) &&
       ((uVar17 & 1) != 0)) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar17);
    }
    uVar21 = (long)pDVar10 +
             (ulong)(uVar15 >> 3) + (ulong)((uint)uVar7 * (uVar20 & 0xffff) + iVar12) * 2;
    uVar17 = (uVar11 & 7) + ((uint)uVar21 & 3) * 8;
    uVar11 = uVar11 - LVar8 & 0xf;
    bVar9 = true;
    local_d4 = 0;
    goto LAB_0010bec2;
  }
  pDVar2 = pDVar2 + uVar17;
  uVar17 = uVar20 & 0xffff;
  if ((pDVar2 == pDVar1) && ((uint)uVar4 <= (uVar20 & 0xffff))) {
    if ((uint)uVar4 + (uint)uVar6 < uVar17) goto LAB_0010bb09;
    if (uVar4 == uVar17) {
      local_e0 = (uint)uVar3;
      if ((uVar15 <= local_e0) || (uVar20 = (uint)uVar3 + (uint)uVar5, uVar20 <= uVar15))
      goto LAB_0010bb09;
    }
    else {
      uVar20 = (uint)uVar3 + (uint)uVar5;
    }
    uVar11 = uVar20 - 1 >> 3;
    if (uVar20 == 0) {
      uVar11 = 0xffffffff;
    }
    uVar18 = (uint)uVar5;
    iVar12 = uVar18 + uVar15;
    uVar21 = (ulong)(iVar12 - 1U >> 3);
    if (iVar12 == 0) {
      uVar21 = 0xffffffffffffffff;
    }
    uVar21 = (long)Lisp_world +
             uVar21 + (ulong)((uVar6 + uVar17 + -1) * (uint)uVar7 + *(int *)pDVar1) * 2;
    iVar14 = ((iVar12 - 1U & 7) + ((uint)uVar21 & 3) * 8) - uVar18;
    uVar17 = iVar14 + 1U & 0x1f;
    bVar9 = false;
    iVar12 = ((uVar20 - 1 & 7) +
             (uVar11 + (int)Lisp_world +
                       ((((uint)uVar4 + (uint)uVar6) - 1) * (uint)pDVar2[3] + *(int *)pDVar2) * 2 &
             3) * 8) - uVar18;
    local_d4 = iVar14 - iVar12;
    uVar11 = iVar12 + 1U & 0x1f;
  }
  else {
LAB_0010bb09:
    uVar21 = (long)Lisp_world + (ulong)(uVar15 >> 3) + (ulong)(uVar7 * uVar17 + *(int *)pDVar1) * 2;
    uVar17 = (uVar11 & 7) + ((uint)uVar21 & 3) * 8;
    uVar11 = (uVar3 & 7) +
             ((uint)(uVar3 >> 3) +
              (int)Lisp_world + ((uint)uVar4 * (uint)pDVar2[3] + *(int *)pDVar2) * 2 & 3) * 8;
    local_d4 = uVar17 - uVar11;
    bVar9 = true;
  }
  local_d4 = local_d4 & 0x1f;
LAB_0010bec2:
  ScreenLocked = 1;
  iVar12 = 0x21 - (uint)uVar5;
  if (uVar19 == uVar16) {
    if (iVar12 <= (int)uVar17) {
      (*(code *)(&DAT_0014370c + *(int *)(&DAT_0014370c + (ulong)uVar13 * 4)))();
      return;
    }
  }
  else if (bVar9) {
    if (iVar12 <= (int)uVar17) {
      (*(code *)(&DAT_001436bc + *(int *)(&DAT_001436bc + (ulong)uVar13 * 4)))();
      return;
    }
  }
  else if (iVar12 <= (int)uVar17) {
    (*(code *)(&DAT_0014366c + *(int *)(&DAT_0014366c + (ulong)uVar13 * 4)))
              (uVar19,local_d4,uVar11,(ulong)uVar13,
               &DAT_0014366c + *(int *)(&DAT_0014366c + (ulong)uVar13 * 4),
               *(undefined4 *)(uVar21 & 0xfffffffffffffffc));
    return;
  }
  (*(code *)(&DAT_0014371c + *(int *)(&DAT_0014371c + (ulong)uVar13 * 4)))();
  return;
}

Assistant:

void bitbltsub(LispPTR *argv) {
  int sourcetype, operation;
  int sty, dty, texture, wxoffset, wyoffset;
  int h, w;
#ifdef REALCURSOR
  int displayflg = 0;
#endif
  int backwardflg = 0, sx, dx, srcbpl=2147483647, dstbpl, src_comp, op;
  DLword *srcbase, *dstbase;
  int gray = 0, num_gray = 0, curr_gray_line = 0;
  DLword grayword[4] = {0, 0, 0, 0};

  { /* Initialization code, in a block so it optimizes independently */
    LispPTR *args = argv;
    PILOTBBT *pbt;
    BITMAP *srcebm, *destbm;
    BITMAP *texture68k;
    DLword *base;

#ifdef INIT
    init_kbd_startup;
#endif

    pbt = (PILOTBBT *)NativeAligned4FromLAddr(args[0]);
    srcebm = (BITMAP *)NativeAligned4FromLAddr(args[1]);
    sx = (args[2] & 0xFFFF);
    sty = (args[3] & 0xFFFF);
    destbm = (BITMAP *)NativeAligned4FromLAddr(args[4]);
    dx = (args[5] & 0xFFFF);
    dty = (args[6] & 0xFFFF);
    sourcetype = (args[8] == NIL_PTR ? INPUT_atom : args[8]);
    operation = (args[9] == NIL_PTR ? REPLACE_atom : args[9]);

    w = pbt->pbtwidth;
    h = pbt->pbtheight;
    if ((h <= 0) || (w <= 0)) return;
    src_comp = bbsrc_type(sourcetype, operation);
    op = bbop(sourcetype, operation);

    dstbpl = destbm->bmrasterwidth << 4;

    if (sourcetype == TEXTURE_atom) {
      texture = args[10];
      wxoffset = (args[11] == NIL_PTR ? 0 : args[11] & 0xFFFF);
      wyoffset = (args[12] == NIL_PTR ? 0 : args[12] & 0xFFFF);
      sx = ((wxoffset) ? (dx - wxoffset) : dx) % BITSPERWORD;
      dstbase = (DLword *)NativeAligned2FromLAddr(ADDBASE(destbm->bmbase, destbm->bmrasterwidth * dty));
      gray = 1;
      if (texture == NIL_PTR) { /* White Shade */
        grayword[0] = 0;
        srcbase = &grayword[0];
        num_gray = 1;
        curr_gray_line = 0;
        goto do_it_now;
      } else if (IsNumber(texture)) {
        if ((texture &= 0xffff) == 0) { /* White Shade */
          grayword[0] = 0;
          srcbase = &grayword[0];
          num_gray = 1;
          curr_gray_line = 0;
          goto do_it_now;
        } else if (texture == 0xffff) { /* Black Shade */
          grayword[0] = 0xFFFF;
          srcbase = &grayword[0];
          num_gray = 1;
          curr_gray_line = 0;
          goto do_it_now;
        } else { /* 4x4 */
          srcbase = base = (DLword *)(&grayword[0]);
          GETWORD(base++) = Expand4Bit(((texture >> 12) & 0xf));
          GETWORD(base++) = Expand4Bit(((texture >> 8) & 0xf));
          GETWORD(base++) = Expand4Bit(((texture >> 4) & 0xf));
          GETWORD(base++) = Expand4Bit((texture & 0xf));
          num_gray = 4;
          curr_gray_line = (dty + wyoffset) & 3;
          srcbase += curr_gray_line;
          goto do_it_now;
        }
      } else { /* A bitmap that is 16 bits wide. */
        texture68k = (BITMAP *)NativeAligned4FromLAddr(texture);
        srcbase = (DLword *)NativeAligned2FromLAddr(texture68k->bmbase);
        num_gray = min(texture68k->bmheight, 16);
        curr_gray_line = (dty + wyoffset) % num_gray;
        srcbase += curr_gray_line;
        goto do_it_now;
      }
    }
    /* ; INPUT or INVERT      */
    srcbpl = srcebm->bmrasterwidth << 4;

    /* compute flags */
    /* out for now
    if(srcebm == destbm)
    if(sty <= dty)
    if(dty <= (sty + h))
    if((sty != dty) || ((sx < dx) && (dx < (sx + w))))
                      backwardflg = T;
    out for now */
    /* compute flags */
    if (srcebm != destbm)
      ;
    else if (sty > dty)
      ;
    else if (dty > (sty + h))
      ;
    else if ((sty != dty) || ((sx < dx) && (dx < (sx + w))))
      backwardflg = T;

    if (backwardflg) {
      srcbase = (DLword *)NativeAligned2FromLAddr(
          ADDBASE(srcebm->bmbase, srcebm->bmrasterwidth * (sty + h - 1)));
      dstbase = (DLword *)NativeAligned2FromLAddr(
          ADDBASE(destbm->bmbase, destbm->bmrasterwidth * (dty + h - 1)));
      srcbpl = 0 - srcbpl;
      dstbpl = 0 - dstbpl;
    } else {
      srcbase = (DLword *)NativeAligned2FromLAddr(ADDBASE(srcebm->bmbase, srcebm->bmrasterwidth * sty));
      dstbase = (DLword *)NativeAligned2FromLAddr(ADDBASE(destbm->bmbase, destbm->bmrasterwidth * dty));
    }
#ifdef REALCURSOR
    displayflg = n_new_cursorin(srcbase, sx, sty, w, h);
#endif /* REALCURSOR */
  }

do_it_now:
#ifdef DOS
  currentdsp->device.locked++;
#else
  ScreenLocked = T;
#endif /* DOS */

#ifdef REALCURSOR
  displayflg |= n_new_cursorin(dstbase, dx, dty, w, h);
  if (displayflg) HideCursor;
#endif /* REALCURSOR */

#ifdef NEWBITBLT
  bitblt(srcbase, dstbase, sx, dx, w, h, srcbpl, dstbpl, backwardflg, src_comp, op, gray, num_gray,
         curr_gray_line);
#else
  new_bitblt_code;
#endif

#ifdef DISPLAYBUFFER
#ifdef COLOR
  if (MonoOrColor == MONO_SCREEN)
#endif /* COLOR */

    /* Copy the changed section of display bank to the frame buffer */
    if (in_display_segment(dstbase)) {
      /*      DBPRINT(("bltsub: x %d, y %d, w %d, h %d.\n",dx, dty, w,h)); */
      flush_display_region(dx, dty, w, h);
    }
#endif

#ifdef XWINDOW
  if (in_display_segment(dstbase)) flush_display_region(dx, dty, w, h);
#endif /* XWINDOW */

#ifdef SDL
  if (in_display_segment(dstbase)) flush_display_region(dx, dty, w, h);
#endif /* XWINDOW */

#ifdef DOS
  /* Copy the changed section of display bank to the frame buffer */
  if (in_display_segment(dstbase)) {
    /*      DBPRINT(("bltsub: x %d, y %d, w %d, h %d.\n",dx, dty, w,h)); */
    flush_display_region(dx, dty, w, h);
  }
#endif /* DOS */

#ifdef REALCURSOR
  if (displayflg) ShowCursor;
#endif /* REALCURSOR */

#ifdef DOS
  currentdsp->device.locked--;
#else
  ScreenLocked = NIL;
#endif /* DOS */

}